

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.cpp
# Opt level: O1

Am_Wrapper * find_start_node_proc(Am_Object *self)

{
  char cVar1;
  int iVar2;
  int iVar3;
  Am_Value *pAVar4;
  Am_Wrapper *pAVar5;
  Am_Value_List nodes;
  Am_Object aAStack_38 [8];
  Am_Object local_30 [8];
  Am_Value_List local_28 [16];
  
  pAVar4 = (Am_Value *)Am_Object::Get((ushort)self,0xa3);
  iVar2 = Am_Value::operator_cast_to_int(pAVar4);
  pAVar4 = (Am_Value *)Am_Object::Get((ushort)self,0x85);
  iVar3 = Am_Value::operator_cast_to_int(pAVar4);
  if (iVar2 == iVar3) {
    pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)&Am_No_Object);
    return pAVar5;
  }
  Am_Object::Get_Object((ushort)local_30,(ulong)self);
  Am_Object::Get_Sibling(aAStack_38,(ushort)local_30,(ulong)NODES);
  pAVar4 = (Am_Value *)Am_Object::Get((ushort)aAStack_38,0x82);
  Am_Value_List::Am_Value_List(local_28,pAVar4);
  Am_Object::~Am_Object(aAStack_38);
  Am_Object::~Am_Object(local_30);
  cVar1 = Am_Value_List::Valid();
  if (cVar1 == '\0') {
    pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)&Am_No_Object);
  }
  else {
    pAVar4 = (Am_Value *)Am_Value_List::Get_Nth((int)local_28);
    pAVar5 = Am_Value::operator_cast_to_Am_Wrapper_(pAVar4);
  }
  Am_Value_List::~Am_Value_List(local_28);
  return pAVar5;
}

Assistant:

Am_Define_Object_Formula(find_start_node)
{
  int parent = self.Get(Am_ITEM);
  int rank = self.Get(Am_RANK);
  if (parent == rank)
    return Am_No_Object;
  Am_Value_List nodes =
      self.Get_Owner().Get_Sibling(NODES).Get(Am_GRAPHICAL_PARTS);
  if (nodes.Valid())
    return nodes.Get_Nth(parent);
  else
    return Am_No_Object;
}